

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O3

pair<spvtools::EnumSet<spv::Capability>,_spvtools::EnumSet<spvtools::Extension>_> * __thiscall
spvtools::opt::TrimCapabilitiesPass::DetermineRequiredCapabilitiesAndExtensions
          (pair<spvtools::EnumSet<spv::Capability>,_spvtools::EnumSet<spvtools::Extension>_>
           *__return_storage_ptr__,TrimCapabilitiesPass *this)

{
  Module *this_00;
  bool bVar1;
  Capability CVar2;
  long lVar3;
  iterator __begin2;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  EnumSet<spv::Capability> local_78;
  ExtensionSet local_58;
  
  local_78.buckets_.
  super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.size_ = 0;
  local_78.buckets_.
  super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.buckets_.
  super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.buckets_.
  super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.size_ = 0;
  local_58.buckets_.
  super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.buckets_.
  super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = (((this->super_Pass).context_)->module_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
            .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  local_98._8_8_ = 0;
  local_98._M_unused._M_object = operator_new(0x18);
  (((EnumSet<spv::Capability> *)local_98._M_unused._0_8_)->buckets_).
  super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)this;
  (((EnumSet<spv::Capability> *)local_98._M_unused._0_8_)->buckets_).
  super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&local_78;
  (((EnumSet<spv::Capability> *)local_98._M_unused._0_8_)->buckets_).
  super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&local_58;
  local_80 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp:626:29)>
             ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp:626:29)>
             ::_M_manager;
  Module::ForEachInst(this_00,(function<void_(spvtools::opt::Instruction_*)> *)&local_98,false);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  EnumSet<spv::Capability>::cbegin((iterator *)&local_98,&local_78);
  lVar3 = (long)local_78.buckets_.
                super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_78.buckets_.
                super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                ._M_impl.super__Vector_impl_data._M_start;
  while ((((EnumSet<spv::Capability> *)local_98._M_unused._0_8_ != &local_78 || ((int)local_88 != 0)
          ) || (local_98._8_8_ != lVar3 >> 4))) {
    CVar2 = EnumSet<spv::Capability>::Iterator::operator*((Iterator *)&local_98);
    AddExtensionsForOperand(this,SPV_OPERAND_TYPE_CAPABILITY,CVar2,&local_58);
    EnumSet<spv::Capability>::Iterator::operator++((Iterator *)&local_98);
  }
  EnumSet<spv::Capability>::cbegin((iterator *)&local_98,&local_78);
  lVar3 = (long)local_78.buckets_.
                super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_78.buckets_.
                super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4;
  if ((((EnumSet<spv::Capability> *)local_98._M_unused._0_8_ != &local_78) || ((int)local_88 != 0))
     || (local_98._8_8_ != lVar3)) {
    do {
      CVar2 = EnumSet<spv::Capability>::Iterator::operator*((Iterator *)&local_98);
      bVar1 = EnumSet<spv::Capability>::contains(&this->supportedCapabilities_,CVar2);
      if (!bVar1) {
        __assert_fail("supportedCapabilities_.contains(capability) && \"Module is using a capability that is not listed as supported.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp"
                      ,0x287,
                      "std::pair<CapabilitySet, ExtensionSet> spvtools::opt::TrimCapabilitiesPass::DetermineRequiredCapabilitiesAndExtensions() const"
                     );
      }
      EnumSet<spv::Capability>::Iterator::operator++((Iterator *)&local_98);
    } while ((((EnumSet<spv::Capability> *)local_98._M_unused._0_8_ != &local_78) ||
             ((int)local_88 != 0)) || (local_98._8_8_ != lVar3));
  }
  (__return_storage_ptr__->first).buckets_.
  super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_78.buckets_.
       super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->first).buckets_.
  super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_78.buckets_.
       super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->first).buckets_.
  super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_78.buckets_.
       super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->first).size_ = local_78.size_;
  (__return_storage_ptr__->second).buckets_.
  super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_58.buckets_.
       super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->second).buckets_.
  super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_58.buckets_.
       super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->second).buckets_.
  super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_58.buckets_.
       super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->second).size_ = local_58.size_;
  return __return_storage_ptr__;
}

Assistant:

std::pair<CapabilitySet, ExtensionSet>
TrimCapabilitiesPass::DetermineRequiredCapabilitiesAndExtensions() const {
  CapabilitySet required_capabilities;
  ExtensionSet required_extensions;

  get_module()->ForEachInst([&](Instruction* instruction) {
    addInstructionRequirements(instruction, &required_capabilities,
                               &required_extensions);
  });

  for (auto capability : required_capabilities) {
    AddExtensionsForOperand(SPV_OPERAND_TYPE_CAPABILITY,
                            static_cast<uint32_t>(capability),
                            &required_extensions);
  }

#if !defined(NDEBUG)
  // Debug only. We check the outputted required capabilities against the
  // supported capabilities list. The supported capabilities list is useful for
  // API users to quickly determine if they can use the pass or not. But this
  // list has to remain up-to-date with the pass code. If we can detect a
  // capability as required, but it's not listed, it means the list is
  // out-of-sync. This method is not ideal, but should cover most cases.
  {
    for (auto capability : required_capabilities) {
      assert(supportedCapabilities_.contains(capability) &&
             "Module is using a capability that is not listed as supported.");
    }
  }
#endif

  return std::make_pair(std::move(required_capabilities),
                        std::move(required_extensions));
}